

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_feature_tests.cpp
# Opt level: O2

void __thiscall iu_StdArray_x_iutest_x_PrintTo_Test::Body(iu_StdArray_x_iutest_x_PrintTo_Test *this)

{
  array<int,_3UL> *v;
  array<int,_3UL> ar;
  PrintToLogChecker ck;
  undefined8 local_238;
  undefined4 local_230;
  string local_228;
  iuCodeMessage local_208;
  PrintToLogChecker local_1d8;
  iuStreamMessage local_190;
  
  PrintToLogChecker::PrintToLogChecker(&local_1d8,"3, 1, 4");
  local_238 = 0x100000003;
  local_230 = 4;
  memset(&local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_190.m_stream);
  iutest::PrintToString<std::array<int,3ul>>(&local_228,(iutest *)&local_238,v);
  iutest::detail::iuStreamMessage::operator<<(&local_190,&local_228);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
             ,0xda,"Succeeded.\n");
  local_208._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_208,(Fixed *)&local_190);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_190.m_stream);
  PrintToLogChecker::~PrintToLogChecker(&local_1d8);
  return;
}

Assistant:

IUTEST(StdArray, PrintTo)
{
    PrintToLogChecker ck("3, 1, 4");
    ::std::array<int, 3> ar = { { 3, 1, 4 } };
    IUTEST_SUCCEED() << ::iutest::PrintToString(ar);
}